

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Name __thiscall wasm::makeHighName(wasm *this,Name n)

{
  long *plVar1;
  long *plVar2;
  string_view sVar3;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  IString *local_40;
  long local_38;
  long lStack_30;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,n.super_IString.str._M_len,this + n.super_IString.str._M_len);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_68);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
    local_48 = (long *)*plVar1;
  }
  local_40 = (IString *)plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  sVar3._M_str = (char *)0x0;
  sVar3._M_len = (size_t)local_48;
  sVar3 = IString::interned(local_40,sVar3,SUB81(plVar2,0));
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return (IString)(IString)sVar3;
}

Assistant:

static Name makeHighName(Name n) { return n.toString() + "$hi"; }